

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionarydata.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UCharsDictionaryMatcher::matches
          (UCharsDictionaryMatcher *this,UText *text,int32_t maxLength,int32_t limit,
          int32_t *lengths,int32_t *cpLengths,int32_t *values,int32_t *prefix)

{
  int iVar1;
  int32_t iVar2;
  int64_t iVar3;
  int64_t iVar4;
  UStringTrieResult local_9c;
  int32_t lengthMatched;
  UStringTrieResult result;
  UChar32 c;
  int32_t codePointsMatched;
  int32_t wordCount;
  int32_t startingTextIndex;
  ConstChar16Ptr local_58;
  undefined1 local_50 [8];
  UCharsTrie uct;
  int32_t *cpLengths_local;
  int32_t *lengths_local;
  int32_t limit_local;
  int32_t maxLength_local;
  UText *text_local;
  UCharsDictionaryMatcher *this_local;
  
  uct._24_8_ = cpLengths;
  ConstChar16Ptr::ConstChar16Ptr(&local_58,this->characters);
  UCharsTrie::UCharsTrie((UCharsTrie *)local_50,&local_58);
  ConstChar16Ptr::~ConstChar16Ptr(&local_58);
  iVar3 = utext_getNativeIndex_63(text);
  c = 0;
  result = USTRINGTRIE_NO_MATCH;
  lengthMatched = utext_next32_63(text);
  while (-1 < lengthMatched) {
    if (result == USTRINGTRIE_NO_MATCH) {
      local_9c = UCharsTrie::first((UCharsTrie *)local_50,lengthMatched);
    }
    else {
      local_9c = UCharsTrie::next((UCharsTrie *)local_50,lengthMatched);
    }
    iVar4 = utext_getNativeIndex_63(text);
    iVar1 = (int)iVar4 - (int)iVar3;
    result = result + USTRINGTRIE_NO_VALUE;
    if ((int)local_9c < 2) {
      if (local_9c == USTRINGTRIE_NO_MATCH) break;
    }
    else {
      if (c < limit) {
        if (values != (int32_t *)0x0) {
          iVar2 = UCharsTrie::getValue((UCharsTrie *)local_50);
          values[c] = iVar2;
        }
        if (lengths != (int32_t *)0x0) {
          lengths[c] = iVar1;
        }
        if (uct._24_8_ != 0) {
          *(UStringTrieResult *)(uct._24_8_ + (long)c * 4) = result;
        }
        c = c + 1;
      }
      if (local_9c == USTRINGTRIE_FINAL_VALUE) break;
    }
    if (maxLength <= iVar1) break;
    lengthMatched = utext_next32_63(text);
  }
  if (prefix != (int32_t *)0x0) {
    *prefix = result;
  }
  UCharsTrie::~UCharsTrie((UCharsTrie *)local_50);
  return c;
}

Assistant:

int32_t UCharsDictionaryMatcher::matches(UText *text, int32_t maxLength, int32_t limit,
                            int32_t *lengths, int32_t *cpLengths, int32_t *values,
                            int32_t *prefix) const {

    UCharsTrie uct(characters);
    int32_t startingTextIndex = (int32_t)utext_getNativeIndex(text);
    int32_t wordCount = 0;
    int32_t codePointsMatched = 0;

    for (UChar32 c = utext_next32(text); c >= 0; c=utext_next32(text)) {
        UStringTrieResult result = (codePointsMatched == 0) ? uct.first(c) : uct.next(c);
        int32_t lengthMatched = (int32_t)utext_getNativeIndex(text) - startingTextIndex;
        codePointsMatched += 1;
        if (USTRINGTRIE_HAS_VALUE(result)) {
            if (wordCount < limit) {
                if (values != NULL) {
                    values[wordCount] = uct.getValue();
                }
                if (lengths != NULL) {
                    lengths[wordCount] = lengthMatched;
                }
                if (cpLengths != NULL) {
                    cpLengths[wordCount] = codePointsMatched;
                }
                ++wordCount;
            }
            if (result == USTRINGTRIE_FINAL_VALUE) {
                break;
            }
        }
        else if (result == USTRINGTRIE_NO_MATCH) {
            break;
        }
        if (lengthMatched >= maxLength) {
            break;
        }
    }

    if (prefix != NULL) {
        *prefix = codePointsMatched;
    }
    return wordCount;
}